

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParamGenerator<const_libaom_test::AV1CodecFactory_*> __thiscall
testing::internal::ValueArray::operator_cast_to_ParamGenerator
          (ValueArray<const_libaom_test::CodecFactory_*> *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 in_RSI;
  element_type *in_RDI;
  ParamGenerator<const_libaom_test::AV1CodecFactory_*> PVar1;
  vector<const_libaom_test::AV1CodecFactory_*,_std::allocator<const_libaom_test::AV1CodecFactory_*>_>
  *in_stack_ffffffffffffffc0;
  vector<const_libaom_test::AV1CodecFactory_*,_std::allocator<const_libaom_test::AV1CodecFactory_*>_>
  *in_stack_ffffffffffffffc8;
  ValueArray<const_libaom_test::CodecFactory_*> local_28 [5];
  
  ValueArray<libaom_test::CodecFactory_const*>::MakeVector<libaom_test::AV1CodecFactory_const*,0ul>
            (local_28,in_RSI);
  ValuesIn<std::vector<libaom_test::AV1CodecFactory_const*,std::allocator<libaom_test::AV1CodecFactory_const*>>>
            (in_stack_ffffffffffffffc8);
  std::
  vector<const_libaom_test::AV1CodecFactory_*,_std::allocator<const_libaom_test::AV1CodecFactory_*>_>
  ::~vector(in_stack_ffffffffffffffc0);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<const_libaom_test::AV1CodecFactory_*>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<const_libaom_test::AV1CodecFactory_*>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = in_RDI;
  return (ParamGenerator<const_libaom_test::AV1CodecFactory_*>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<const_libaom_test::AV1CodecFactory_*>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }